

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::TreeIndex<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>::
insert<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry,unsigned_long&>
          (TreeIndex<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Callbacks> *this,
          ArrayPtr<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> table,size_t pos,
          unsigned_long *params)

{
  uint uVar1;
  ulong uVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar3;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  unsigned_long *in_R9;
  Maybe<unsigned_long> MVar4;
  Iterator iter;
  ArrayPtr<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> table_local;
  SearchKey local_40;
  Entry *local_38;
  ArrayPtr<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> *local_30;
  
  table_local.ptr = (Entry *)table.size_;
  local_38 = table.ptr;
  local_30 = &table_local;
  local_40._vptr_SearchKey = (_func_int **)&PTR_search_0025d5d0;
  table_local.size_ = pos;
  _::BTreeImpl::insert(&iter,(BTreeImpl *)&local_38->value,&local_40);
  uVar2 = (ulong)iter.row;
  if (uVar2 == 0xe) {
    uVar2 = 0xe;
  }
  else {
    uVar1 = (iter.leaf)->rows[uVar2].i;
    if ((uVar1 != 0) &&
       (aVar3._0_4_ = uVar1 - 1, aVar3.value._4_4_ = 0, table_local.ptr[aVar3.value].key == *in_R9))
    {
      *this = (TreeIndex<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>)0x1;
      ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(this + 8))->value =
           (unsigned_long)aVar3;
      goto LAB_0019cc86;
    }
  }
  memmove((iter.leaf)->rows + uVar2 + 1,(iter.leaf)->rows + uVar2,(ulong)(iter.row + 1) * -4 + 0x38)
  ;
  (iter.leaf)->rows[uVar2].i = (int)params + 1;
  *this = (TreeIndex<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>)0x0;
  aVar3 = extraout_RDX;
LAB_0019cc86:
  MVar4.ptr.field_1.value = aVar3.value;
  MVar4.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar4.ptr;
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    auto iter = impl.insert(searchKey(table, params...));

    if (!iter.isEnd() && cb.matches(table[*iter], params...)) {
      return *iter;
    } else {
      iter.insert(impl, pos);
      return kj::none;
    }
  }